

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_size_tests.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_183fe20::AV1FrameSizeTests_OneByOneVideo_Test::TestBody
          (AV1FrameSizeTests_OneByOneVideo_Test *this)

{
  bool bVar1;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  RandomVideoSource video;
  AssertHelper local_70;
  HasNewFatalFailureHelper local_68;
  undefined1 local_50 [56];
  
  local_50._0_8_ = &PTR__DummyVideoSource_01074718;
  local_50._8_8_ = (aom_image_t *)0x0;
  local_50._24_4_ = 100;
  local_50._32_4_ = 0x50;
  local_50._36_4_ = 0x40;
  local_50._40_4_ = AOM_IMG_FMT_I420;
  libaom_test::DummyVideoSource::ReallocImage((DummyVideoSource *)local_50);
  local_50._0_8_ = &PTR__DummyVideoSource_01087218;
  local_50._44_8_ = 0xbaba0000baba;
  if ((local_50._32_4_ != 1) || (local_50._36_4_ != 1)) {
    local_50._32_4_ = 1;
    local_50._36_4_ = 1;
    libaom_test::DummyVideoSource::ReallocImage((DummyVideoSource *)local_50);
  }
  local_50._24_4_ = 2;
  *(undefined4 *)&(this->super_AV1FrameSizeTests).super_EncoderTest.field_0x3dc = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(&local_68);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(this->super_AV1FrameSizeTests).super_EncoderTest._vptr_EncoderTest[2])
                (&(this->super_AV1FrameSizeTests).super_EncoderTest,local_50);
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper(&local_68);
    if (local_68.has_new_fatal_failure_ == false) goto LAB_00676cb6;
  }
  testing::Message::Message((Message *)&local_68);
  testing::internal::AssertHelper::AssertHelper
            (&local_70,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
             ,0x50,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_68);
  testing::internal::AssertHelper::~AssertHelper(&local_70);
  if (local_68.super_TestPartResultReporterInterface._vptr_TestPartResultReporterInterface !=
      (_func_int **)0x0) {
    (**(code **)(*local_68.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_00676cb6:
  local_50._0_8_ = &PTR__DummyVideoSource_01074718;
  aom_img_free((aom_image_t *)local_50._8_8_);
  return;
}

Assistant:

TEST_F(AV1FrameSizeTests, OneByOneVideo) {
  ::libaom_test::RandomVideoSource video;

  video.SetSize(1, 1);
  video.set_limit(2);
  expected_res_ = AOM_CODEC_OK;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
}